

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

ElementDocument * __thiscall
Rml::Context::LoadDocumentFromMemory(Context *this,String *string,String *source_url)

{
  pointer pSVar1;
  ElementDocument *pEVar2;
  ElementDocument *document;
  URL local_170;
  undefined8 local_38;
  unsigned_long local_30;
  unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> local_28;
  UniquePtr<Rml::StreamMemory> stream;
  String *source_url_local;
  String *string_local;
  Context *this_local;
  
  stream._M_t.super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>._M_t
  .super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
  super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl =
       (__uniq_ptr_data<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>,_true,_true>)
       (__uniq_ptr_data<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>,_true,_true>)
       source_url;
  local_30 = ::std::__cxx11::string::c_str();
  local_38 = ::std::__cxx11::string::size();
  MakeUnique<Rml::StreamMemory,unsigned_char_const*,unsigned_long>((uchar **)&local_28,&local_30);
  pSVar1 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::operator->
                     (&local_28);
  URL::URL(&local_170,
           (String *)
           stream._M_t.
           super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>._M_t.
           super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
           super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl);
  StreamMemory::SetSourceURL(pSVar1,&local_170);
  URL::~URL(&local_170);
  pSVar1 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::get
                     (&local_28);
  pEVar2 = LoadDocument(this,&pSVar1->super_Stream);
  ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
            (&local_28);
  return pEVar2;
}

Assistant:

ElementDocument* Context::LoadDocumentFromMemory(const String& string, const String& source_url)
{
	// Open the stream based on the string contents.
	auto stream = MakeUnique<StreamMemory>(reinterpret_cast<const byte*>(string.c_str()), string.size());

	stream->SetSourceURL(source_url);

	// Load the document from the stream.
	ElementDocument* document = LoadDocument(stream.get());

	return document;
}